

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Publication.cpp
# Opt level: O0

void __thiscall
aeron::Publication::Publication
          (Publication *this,ClientConductor *conductor,string *channel,int64_t registrationId,
          int64_t originalRegistrationId,int32_t streamId,int32_t sessionId,
          UnsafeBufferPosition *publicationLimit,int32_t channelStatusId,
          shared_ptr<aeron::LogBuffers> *logBuffers)

{
  index_t iVar1;
  int32_t iVar2;
  int iVar3;
  element_type *peVar4;
  AtomicBuffer *pAVar5;
  TermAppender *this_00;
  AtomicBuffer *metaDataBuffer;
  undefined8 in_RCX;
  string *in_RDX;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  undefined8 in_R8;
  undefined4 in_R9D;
  undefined4 in_stack_00000008;
  undefined4 in_stack_00000018;
  int i;
  undefined7 in_stack_fffffffffffffeb8;
  undefined1 in_stack_fffffffffffffebf;
  ReadablePosition<aeron::concurrent::status::UnsafeBufferPosition> *in_stack_fffffffffffffec0;
  AtomicBuffer *in_stack_fffffffffffffec8;
  HeaderWriter *in_stack_fffffffffffffed0;
  undefined8 *local_f0;
  int local_5c;
  AtomicBuffer local_58;
  undefined4 local_2c;
  undefined8 local_28;
  undefined8 local_20;
  string *local_18;
  
  *in_RDI = &PTR__Publication_0022dc48;
  in_RDI[1] = in_RSI;
  local_2c = in_R9D;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  peVar4 = std::__shared_ptr_access<aeron::LogBuffers,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<aeron::LogBuffers,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x1f0961);
  pAVar5 = LogBuffers::atomicBuffer(peVar4,3);
  in_RDI[2] = pAVar5;
  std::__cxx11::string::string((string *)(in_RDI + 3),local_18);
  in_RDI[7] = local_20;
  in_RDI[8] = local_28;
  peVar4 = std::__shared_ptr_access<aeron::LogBuffers,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<aeron::LogBuffers,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x1f09cc);
  pAVar5 = LogBuffers::atomicBuffer(peVar4,0);
  iVar1 = concurrent::AtomicBuffer::capacity(pAVar5);
  in_RDI[9] = (long)iVar1 << 0x1f;
  *(undefined4 *)(in_RDI + 10) = local_2c;
  *(undefined4 *)((long)in_RDI + 0x54) = in_stack_00000008;
  iVar2 = concurrent::logbuffer::LogBufferDescriptor::initialTermId((AtomicBuffer *)0x1f0a43);
  *(int32_t *)(in_RDI + 0xb) = iVar2;
  iVar2 = concurrent::logbuffer::LogBufferDescriptor::mtuLength((AtomicBuffer *)0x1f0a7d);
  *(int32_t *)((long)in_RDI + 0x5c) = iVar2 + -0x20;
  peVar4 = std::__shared_ptr_access<aeron::LogBuffers,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<aeron::LogBuffers,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x1f0abb);
  pAVar5 = LogBuffers::atomicBuffer(peVar4,0);
  concurrent::AtomicBuffer::capacity(pAVar5);
  iVar1 = concurrent::logbuffer::FrameDescriptor::computeMaxMessageLength(0);
  *(index_t *)(in_RDI + 0xc) = iVar1;
  peVar4 = std::__shared_ptr_access<aeron::LogBuffers,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<aeron::LogBuffers,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x1f0b29);
  pAVar5 = LogBuffers::atomicBuffer(peVar4,0);
  iVar1 = concurrent::AtomicBuffer::capacity(pAVar5);
  iVar3 = util::BitUtil::numberOfTrailingZeroes<int>(iVar1);
  *(int *)((long)in_RDI + 100) = iVar3;
  concurrent::status::ReadablePosition<aeron::concurrent::status::UnsafeBufferPosition>::
  ReadablePosition(in_stack_fffffffffffffec0,
                   (UnsafeBufferPosition *)
                   CONCAT17(in_stack_fffffffffffffebf,in_stack_fffffffffffffeb8));
  *(undefined4 *)(in_RDI + 0x11) = in_stack_00000018;
  std::atomic<bool>::atomic
            ((atomic<bool> *)in_stack_fffffffffffffec0,(bool)in_stack_fffffffffffffebf);
  std::shared_ptr<aeron::LogBuffers>::shared_ptr
            ((shared_ptr<aeron::LogBuffers> *)in_stack_fffffffffffffec0,
             (shared_ptr<aeron::LogBuffers> *)
             CONCAT17(in_stack_fffffffffffffebf,in_stack_fffffffffffffeb8));
  local_f0 = in_RDI + 0x14;
  do {
    std::
    unique_ptr<aeron::concurrent::logbuffer::TermAppender,std::default_delete<aeron::concurrent::logbuffer::TermAppender>>
    ::unique_ptr<std::default_delete<aeron::concurrent::logbuffer::TermAppender>,void>
              ((unique_ptr<aeron::concurrent::logbuffer::TermAppender,_std::default_delete<aeron::concurrent::logbuffer::TermAppender>_>
                *)in_stack_fffffffffffffec0);
    local_f0 = local_f0 + 1;
  } while (local_f0 != in_RDI + 0x17);
  concurrent::logbuffer::LogBufferDescriptor::defaultFrameHeader(in_stack_fffffffffffffec8);
  concurrent::logbuffer::HeaderWriter::HeaderWriter
            (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
  concurrent::AtomicBuffer::~AtomicBuffer(&local_58);
  for (local_5c = 0; local_5c < 3; local_5c = local_5c + 1) {
    this_00 = (TermAppender *)operator_new(0x18);
    peVar4 = std::__shared_ptr_access<aeron::LogBuffers,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<aeron::LogBuffers,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1f0c8d);
    pAVar5 = LogBuffers::atomicBuffer(peVar4,local_5c);
    peVar4 = std::__shared_ptr_access<aeron::LogBuffers,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<aeron::LogBuffers,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1f0cb0);
    metaDataBuffer = LogBuffers::atomicBuffer(peVar4,3);
    concurrent::logbuffer::TermAppender::TermAppender(this_00,pAVar5,metaDataBuffer,local_5c);
    std::
    unique_ptr<aeron::concurrent::logbuffer::TermAppender,std::default_delete<aeron::concurrent::logbuffer::TermAppender>>
    ::unique_ptr<std::default_delete<aeron::concurrent::logbuffer::TermAppender>,void>
              ((unique_ptr<aeron::concurrent::logbuffer::TermAppender,_std::default_delete<aeron::concurrent::logbuffer::TermAppender>_>
                *)in_stack_fffffffffffffec0,
               (pointer)CONCAT17(in_stack_fffffffffffffebf,in_stack_fffffffffffffeb8));
    std::
    unique_ptr<aeron::concurrent::logbuffer::TermAppender,_std::default_delete<aeron::concurrent::logbuffer::TermAppender>_>
    ::operator=((unique_ptr<aeron::concurrent::logbuffer::TermAppender,_std::default_delete<aeron::concurrent::logbuffer::TermAppender>_>
                 *)in_stack_fffffffffffffec0,
                (unique_ptr<aeron::concurrent::logbuffer::TermAppender,_std::default_delete<aeron::concurrent::logbuffer::TermAppender>_>
                 *)CONCAT17(in_stack_fffffffffffffebf,in_stack_fffffffffffffeb8));
    std::
    unique_ptr<aeron::concurrent::logbuffer::TermAppender,_std::default_delete<aeron::concurrent::logbuffer::TermAppender>_>
    ::~unique_ptr((unique_ptr<aeron::concurrent::logbuffer::TermAppender,_std::default_delete<aeron::concurrent::logbuffer::TermAppender>_>
                   *)in_stack_fffffffffffffec0);
  }
  return;
}

Assistant:

Publication::Publication(
    ClientConductor &conductor,
    const std::string &channel,
    std::int64_t registrationId,
    std::int64_t originalRegistrationId,
    std::int32_t streamId,
    std::int32_t sessionId,
    UnsafeBufferPosition& publicationLimit,
    std::int32_t channelStatusId,
    std::shared_ptr<LogBuffers> logBuffers)
    :
    m_conductor(conductor),
    m_logMetaDataBuffer(logBuffers->atomicBuffer(LogBufferDescriptor::LOG_META_DATA_SECTION_INDEX)),
    m_channel(channel),
    m_registrationId(registrationId),
    m_originalRegistrationId(originalRegistrationId),
    m_maxPossiblePosition(static_cast<int64_t>(logBuffers->atomicBuffer(0).capacity()) << 31),
    m_streamId(streamId),
    m_sessionId(sessionId),
    m_initialTermId(LogBufferDescriptor::initialTermId(m_logMetaDataBuffer)),
    m_maxPayloadLength(LogBufferDescriptor::mtuLength(m_logMetaDataBuffer) - DataFrameHeader::LENGTH),
    m_maxMessageLength(FrameDescriptor::computeMaxMessageLength(logBuffers->atomicBuffer(0).capacity())),
    m_positionBitsToShift(util::BitUtil::numberOfTrailingZeroes(logBuffers->atomicBuffer(0).capacity())),
    m_publicationLimit(publicationLimit),
    m_channelStatusId(channelStatusId),
    m_logBuffers(logBuffers),
    m_headerWriter(LogBufferDescriptor::defaultFrameHeader(m_logMetaDataBuffer))
{
    for (int i = 0; i < LogBufferDescriptor::PARTITION_COUNT; i++)
    {
        /*
         * TODO:
         * perhaps allow copy-construction and be able to move appenders and AtomicBuffers directly into Publication for
         * locality.
         */
        m_appenders[i] = std::unique_ptr<TermAppender>(new TermAppender(
            logBuffers->atomicBuffer(i),
            logBuffers->atomicBuffer(LogBufferDescriptor::LOG_META_DATA_SECTION_INDEX),
            i));
    }
}